

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.cpp
# Opt level: O0

Base_game * cpp_client::Game_registry::get_game(string *name)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>,_cpp_client::Game_registry::Hasher,_cpp_client::Game_registry::Comper,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>_>
  *puVar1;
  size_type sVar2;
  mapped_type *this;
  type pBVar3;
  Game_not_found *this_00;
  char local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  key_type *local_10;
  string *name_local;
  
  local_10 = name;
  puVar1 = name_map_abi_cxx11_();
  sVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>,_cpp_client::Game_registry::Hasher,_cpp_client::Game_registry::Comper,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>_>
          ::count(puVar1,local_10);
  if (sVar2 != 0) {
    puVar1 = name_map_abi_cxx11_();
    this = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>,_cpp_client::Game_registry::Hasher,_cpp_client::Game_registry::Comper,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>_>
           ::operator[](puVar1,local_10);
    pBVar3 = std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>::
             operator*(this);
    return pBVar3;
  }
  this_00 = (Game_not_found *)__cxa_allocate_exception(0x10);
  std::operator+(local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "The requested game \"");
  std::operator+(local_30,local_50);
  Game_not_found::range_error(this_00,local_30);
  __cxa_throw(this_00,&Game_not_found::typeinfo,Game_not_found::~Game_not_found);
}

Assistant:

Base_game& Game_registry::get_game(const std::string& name)
{
   if(name_map().count(name))
   {
      return *name_map()[name];
   }
   else
   {
      throw Game_not_found("The requested game \"" + name + "\" was not found.");
   }
}